

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImGui::FindRenderedTextEnd(char *text,char *text_end)

{
  char *text_display_end;
  
  do {
    if ((char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end) <= text) {
      return text;
    }
    if (*text == '#') {
      if (text[1] == '#') {
        return text;
      }
    }
    else if (*text == '\0') {
      return text;
    }
    text = text + 1;
  } while( true );
}

Assistant:

const char* ImGui::FindRenderedTextEnd(const char* text, const char* text_end)
{
    const char* text_display_end = text;
    if (!text_end)
        text_end = (const char*)-1;

    while (text_display_end < text_end && *text_display_end != '\0' && (text_display_end[0] != '#' || text_display_end[1] != '#'))
        text_display_end++;
    return text_display_end;
}